

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O0

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL> *
RankUnserialize(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
                *__return_storage_ptr__,string *serialized)

{
  uint uVar1;
  reference pcVar2;
  reference this;
  size_type __n;
  bool bVar3;
  string local_78 [48];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  int local_34;
  unsigned_long uStack_30;
  int i;
  size_t lastp;
  size_t p;
  string *local_18;
  string *serialized_local;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL> *list;
  
  p._7_1_ = 0;
  local_18 = serialized;
  serialized_local = __return_storage_ptr__->_M_elems;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>::
  array(__return_storage_ptr__);
  lastp = 0;
  uStack_30 = std::numeric_limits<unsigned_long>::max();
  local_34 = 0;
  uVar1 = std::__cxx11::string::empty();
  bVar3 = false;
  if ((uVar1 & 1) == 0) {
    local_48._M_current = (char *)std::__cxx11::string::end();
    local_40 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator-(&local_48,1);
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_40);
    bVar3 = *pcVar2 != ',';
  }
  if (bVar3) {
    std::__cxx11::string::push_back((char)serialized);
  }
  while( true ) {
    bVar3 = false;
    if (local_34 < 9) {
      lastp = std::__cxx11::string::find_first_of((char)serialized,0x2c);
      bVar3 = lastp != 0xffffffffffffffff;
    }
    if (!bVar3) break;
    std::__cxx11::string::substr((ulong)local_78,(ulong)serialized);
    __n = (size_type)local_34;
    local_34 = local_34 + 1;
    this = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
           ::operator[](__return_storage_ptr__,__n);
    std::__cxx11::string::operator=((string *)this,local_78);
    std::__cxx11::string::~string(local_78);
    uStack_30 = lastp;
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<std::string, 9> RankUnserialize(std::string serialized)
{
	std::array<std::string, 9> list;
	std::size_t p = 0;
	std::size_t lastp = std::numeric_limits<std::size_t>::max();
	int i = 0;

	if (!serialized.empty() && *(serialized.end()-1) != ',')
	{
		serialized.push_back(',');
	}

	while (i < 9 && (p = serialized.find_first_of(',', lastp+1)) != std::string::npos)
	{
		list[i++] = serialized.substr(lastp+1, p-lastp-1);
		lastp = p;
	}

	return list;
}